

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall node::NodeContext::NodeContext(NodeContext *this)

{
  long lVar1;
  function<void_()> *in_RDI;
  long in_FS_OFFSET;
  vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *in_stack_ffffffffffffffd8;
  function<void_()> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::unique_ptr<kernel::Context,std::default_delete<kernel::Context>>::
  unique_ptr<std::default_delete<kernel::Context>,void>
            ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
             in_stack_ffffffffffffffd8);
  std::unique_ptr<ECC_Context,std::default_delete<ECC_Context>>::
  unique_ptr<std::default_delete<ECC_Context>,void>
            ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)in_stack_ffffffffffffffd8
            );
  (in_RDI->super__Function_base)._M_manager = (_Manager_type)0x0;
  in_RDI->_M_invoker = (_Invoker_type)0x0;
  std::unique_ptr<AddrMan,std::default_delete<AddrMan>>::
  unique_ptr<std::default_delete<AddrMan>,void>
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffffd8);
  std::unique_ptr<CConnman,std::default_delete<CConnman>>::
  unique_ptr<std::default_delete<CConnman>,void>
            ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)in_stack_ffffffffffffffd8);
  std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>::
  unique_ptr<std::default_delete<CTxMemPool>,void>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffffd8);
  std::unique_ptr<NetGroupManager_const,std::default_delete<NetGroupManager_const>>::
  unique_ptr<std::default_delete<NetGroupManager_const>,void>
            ((unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> *)
             in_stack_ffffffffffffffd8);
  std::unique_ptr<CBlockPolicyEstimator,std::default_delete<CBlockPolicyEstimator>>::
  unique_ptr<std::default_delete<CBlockPolicyEstimator>,void>
            ((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> *)
             in_stack_ffffffffffffffd8);
  std::unique_ptr<PeerManager,std::default_delete<PeerManager>>::
  unique_ptr<std::default_delete<PeerManager>,void>
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)in_stack_ffffffffffffffd8
            );
  std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>::
  unique_ptr<std::default_delete<ChainstateManager>,void>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffffd8);
  std::unique_ptr<BanMan,std::default_delete<BanMan>>::unique_ptr<std::default_delete<BanMan>,void>
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)in_stack_ffffffffffffffd8);
  *(undefined8 *)&in_RDI[3].super__Function_base._M_functor = 0;
  std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::vector(in_stack_ffffffffffffffd8);
  std::unique_ptr<interfaces::Chain,std::default_delete<interfaces::Chain>>::
  unique_ptr<std::default_delete<interfaces::Chain>,void>
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffffd8);
  std::
  vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
  ::vector((vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
            *)in_stack_ffffffffffffffd8);
  std::unique_ptr<interfaces::Mining,std::default_delete<interfaces::Mining>>::
  unique_ptr<std::default_delete<interfaces::Mining>,void>
            ((unique_ptr<interfaces::Mining,_std::default_delete<interfaces::Mining>_> *)
             in_stack_ffffffffffffffd8);
  *(undefined8 *)((long)&in_RDI[5].super__Function_base._M_functor + 8) = 0;
  std::unique_ptr<CScheduler,std::default_delete<CScheduler>>::
  unique_ptr<std::default_delete<CScheduler>,void>
            ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)in_stack_ffffffffffffffd8);
  std::function<void()>::function<node::NodeContext::rpc_interruption_point::_lambda()_1_,void>
            (this_00,(anon_class_1_0_00000001 *)in_RDI);
  std::unique_ptr<node::KernelNotifications,std::default_delete<node::KernelNotifications>>::
  unique_ptr<std::default_delete<node::KernelNotifications>,void>
            ((unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
              *)in_stack_ffffffffffffffd8);
  std::unique_ptr<ValidationSignals,std::default_delete<ValidationSignals>>::
  unique_ptr<std::default_delete<ValidationSignals>,void>
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             in_stack_ffffffffffffffd8);
  std::atomic<int>::atomic((atomic<int> *)in_stack_ffffffffffffffd8,0);
  std::unique_ptr<node::Warnings,std::default_delete<node::Warnings>>::
  unique_ptr<std::default_delete<node::Warnings>,void>
            ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
             in_stack_ffffffffffffffd8);
  std::thread::thread((thread *)in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

NodeContext::NodeContext() = default;